

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void ServerNetworkLayerTCP_closeConnection(UA_Connection *connection)

{
  if (connection->state == UA_CONNECTION_CLOSED) {
    return;
  }
  connection->state = UA_CONNECTION_CLOSED;
  UA_LOG_INFO(*(UA_Logger *)((long)connection->handle + 0x18),UA_LOGCATEGORY_NETWORK,
              "Connection %i | Force closing the connection",(ulong)(uint)connection->sockfd);
  shutdown(connection->sockfd,2);
  return;
}

Assistant:

static void
ServerNetworkLayerTCP_closeConnection(UA_Connection *connection) {
#ifdef UA_ENABLE_MULTITHREADING
    if(uatomic_xchg(&connection->state, UA_CONNECTION_CLOSED) == UA_CONNECTION_CLOSED)
        return;
#else
    if(connection->state == UA_CONNECTION_CLOSED)
        return;
    connection->state = UA_CONNECTION_CLOSED;
#endif
#if UA_LOGLEVEL <= 300
   //cppcheck-suppress unreadVariable
    ServerNetworkLayerTCP *layer = connection->handle;
    UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                "Connection %i | Force closing the connection",
                connection->sockfd);
#endif
    /* only "shutdown" here. this triggers the select, where the socket is
       "closed" in the mainloop */
    shutdown(connection->sockfd, 2);
}